

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

fy_eventp * fy_parse_node(fy_parser *fyp,fy_token *fyt,_Bool is_block)

{
  uint uVar1;
  fy_document_state *fyds_00;
  fy_parser_state fVar2;
  fy_token *pfVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  undefined1 local_168 [8];
  fy_diag_report_ctx _drc_4;
  fy_diag_report_ctx _drc_3;
  fy_diag_report_ctx _drc_2;
  fy_diag_report_ctx _drc_1;
  fy_diag_report_ctx _drc;
  fy_token *fyt_td;
  fy_atom atom;
  size_t handle_size;
  char *handle;
  fy_token *tag;
  fy_token *anchor;
  fy_document_state *fyds;
  fy_event *fye;
  fy_eventp *fyep;
  fy_token *pfStack_20;
  _Bool is_block_local;
  fy_token *fyt_local;
  fy_parser *fyp_local;
  
  fye = (fy_event *)0x0;
  tag = (fy_token *)0x0;
  handle = (char *)0x0;
  fyds_00 = fyp->current_document_state;
  if (fyds_00 == (fy_document_state *)0x0) {
    __assert_fail("fyds",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                  ,0xf30,
                  "struct fy_eventp *fy_parse_node(struct fy_parser *, struct fy_token *, _Bool)");
  }
  pcVar5 = "false";
  if (is_block) {
    pcVar5 = "true";
  }
  pcVar7 = fy_token_type_txt[fyt->type];
  fy_parser_diag(fyp,0x30,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,0xf34,"fy_parse_node","parse_node: is_block=%s - fyt %s",pcVar5,pcVar7);
  pfStack_20 = fyt;
  if (fyt->type == FYTT_ALIAS) {
    fVar2 = fy_parse_state_pop(fyp);
    fy_parse_state_set(fyp,fVar2);
    fye = (fy_event *)fy_parse_eventp_alloc(fyp);
    if ((fy_eventp *)fye != (fy_eventp *)0x0) {
      fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
      ((fy_event *)fyds)->type = FYET_ALIAS;
      pfVar3 = fy_scan_remove(fyp,fyt);
      (((fy_eventp *)fye)->e).field_1.document_start.document_start = pfVar3;
LAB_0014fdba:
      fy_parser_diag(fyp,0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xff0,"fy_parse_node","parse_node: > %s",
                     fy_event_type_txt[*(uint *)&(fyds->node).next]);
      return (fy_eventp *)fye;
    }
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xf3b,"fy_parse_node","fy_eventp_alloc() failed!",pcVar5,pcVar7);
    fye = (fy_event *)0x0;
  }
  else {
    do {
      if (((tag != (fy_token *)0x0) || (bVar6 = true, pfStack_20->type != FYTT_ANCHOR)) &&
         (bVar6 = false, handle == (char *)0x0)) {
        bVar6 = pfStack_20->type == FYTT_TAG;
      }
      if (!bVar6) {
        if ((handle != (char *)0x0) && (*(int *)(handle + 0x11c) != 0)) {
          pcVar4 = fy_atom_data((fy_atom *)(handle + 0x38));
          uVar1 = *(uint *)(handle + 0x118);
          atom._48_8_ = ZEXT48(*(uint *)(handle + 0x11c));
          pfVar3 = fy_document_state_lookup_tag_directive(fyds_00,pcVar4 + uVar1,atom._48_8_);
          if (pfVar3 == (fy_token *)0x0) {
            memset(&_drc_2.override_line,0,0x28);
            _drc_2.override_line = 4;
            _drc_2.override_column = 3;
            _drc_1._0_8_ = fy_token_ref((fy_token *)handle);
            fy_parser_diag_report
                      (fyp,(fy_diag_report_ctx *)&_drc_2.override_line,
                       "undefined tag prefix \'%.*s\'",atom._48_8_ & 0xffffffff,pcVar4 + uVar1);
            goto LAB_0014fe05;
          }
        }
        if ((((fyp->state == FYPS_BLOCK_NODE_OR_INDENTLESS_SEQUENCE) ||
             (fyp->state == FYPS_BLOCK_MAPPING_VALUE)) ||
            (fyp->state == FYPS_BLOCK_MAPPING_FIRST_KEY)) && (pfStack_20->type == FYTT_BLOCK_ENTRY))
        {
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xf69,"fy_parse_node","fy_eventp_alloc() failed!",pcVar5,pcVar7);
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_SEQUENCE_START;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          memcpy(&fyt_td,&pfStack_20->handle,0x38);
          atom.start_mark._8_8_ = fyt_td;
          atom.end_mark.input_pos = atom.start_mark.input_pos;
          pfVar3 = fy_token_create(FYTT_BLOCK_SEQUENCE_START,&fyt_td);
          (((fy_eventp *)fye)->e).field_1.scalar.value = pfVar3;
          if ((((fy_eventp *)fye)->e).field_1.scalar.value == (fy_token *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xf74,"fy_parse_node","fy_token_create() failed!");
            goto LAB_0014fe05;
          }
          fy_parse_state_set(fyp,FYPS_INDENTLESS_SEQUENCE_ENTRY);
          goto LAB_0014fdba;
        }
        if (pfStack_20->type == FYTT_SCALAR) {
          fVar2 = fy_parse_state_pop(fyp);
          fy_parse_state_set(fyp,fVar2);
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xf7f,"fy_parse_node","fy_eventp_alloc() failed!");
            fye = (fy_event *)0x0;
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_SCALAR;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          pfVar3 = fy_scan_remove(fyp,pfStack_20);
          (((fy_eventp *)fye)->e).field_1.scalar.value = pfVar3;
          goto LAB_0014fdba;
        }
        if (pfStack_20->type == FYTT_FLOW_SEQUENCE_START) {
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xf8d,"fy_parse_node","fy_eventp_alloc() failed!",pcVar5,pcVar7);
            fye = (fy_event *)0x0;
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_SEQUENCE_START;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          pfVar3 = fy_scan_remove(fyp,pfStack_20);
          (((fy_eventp *)fye)->e).field_1.scalar.value = pfVar3;
          fy_parse_state_set(fyp,FYPS_FLOW_SEQUENCE_FIRST_ENTRY);
          goto LAB_0014fdba;
        }
        if (pfStack_20->type == FYTT_FLOW_MAPPING_START) {
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xf9c,"fy_parse_node","fy_eventp_alloc() failed!",pcVar5,pcVar7);
            fye = (fy_event *)0x0;
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_MAPPING_START;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          pfVar3 = fy_scan_remove(fyp,pfStack_20);
          (((fy_eventp *)fye)->e).field_1.scalar.value = pfVar3;
          fy_parse_state_set(fyp,FYPS_FLOW_MAPPING_FIRST_KEY);
          goto LAB_0014fdba;
        }
        if ((is_block) && (pfStack_20->type == FYTT_BLOCK_SEQUENCE_START)) {
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xfab,"fy_parse_node","fy_eventp_alloc() failed!",pcVar5,pcVar7);
            fye = (fy_event *)0x0;
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_SEQUENCE_START;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          pfVar3 = fy_scan_remove(fyp,pfStack_20);
          (((fy_eventp *)fye)->e).field_1.scalar.value = pfVar3;
          fy_parse_state_set(fyp,FYPS_BLOCK_SEQUENCE_FIRST_ENTRY);
          goto LAB_0014fdba;
        }
        if ((is_block) && (pfStack_20->type == FYTT_BLOCK_MAPPING_START)) {
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xfba,"fy_parse_node","fy_eventp_alloc() failed!",pcVar5,pcVar7);
            fye = (fy_event *)0x0;
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_MAPPING_START;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          pfVar3 = fy_scan_remove(fyp,pfStack_20);
          (((fy_eventp *)fye)->e).field_1.scalar.value = pfVar3;
          fy_parse_state_set(fyp,FYPS_BLOCK_MAPPING_FIRST_KEY);
          goto LAB_0014fdba;
        }
        if ((tag != (fy_token *)0x0) || (handle != (char *)0x0)) {
          fy_parser_diag(fyp,0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0xfdf,"fy_parse_node","parse_node: empty scalar...",pcVar5,pcVar7);
          fVar2 = fy_parse_state_pop(fyp);
          fy_parse_state_set(fyp,fVar2);
          fye = (fy_event *)fy_parse_eventp_alloc(fyp);
          if ((fy_eventp *)fye == (fy_eventp *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xfe6,"fy_parse_node","fy_eventp_alloc() failed!");
            fye = (fy_event *)0x0;
            goto LAB_0014fe05;
          }
          fyds = (fy_document_state *)&((fy_eventp *)fye)->e;
          ((fy_event *)fyds)->type = FYET_SCALAR;
          (((fy_eventp *)fye)->e).field_1.document_start.document_start = tag;
          (((fy_eventp *)fye)->e).field_1.document_start.document_state =
               (fy_document_state *)handle;
          (((fy_eventp *)fye)->e).field_1.scalar.value = (fy_token *)0x0;
          goto LAB_0014fdba;
        }
        if ((pfStack_20->type == FYTT_FLOW_ENTRY) &&
           ((fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ||
            (fyp->state == FYPS_FLOW_SEQUENCE_ENTRY)))) {
          memset(&_drc_3.override_line,0,0x28);
          _drc_3.override_line = 4;
          _drc_3.override_column = 3;
          _drc_2._0_8_ = fy_token_ref(pfStack_20);
          pcVar5 = "extra comma";
          if (fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY) {
            pcVar5 = "comma in the beginning";
          }
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)&_drc_3.override_line,"flow sequence with invalid %s"
                     ,pcVar5);
        }
        else if (((pfStack_20->type == FYTT_DOCUMENT_START) ||
                 (pfStack_20->type == FYTT_DOCUMENT_END)) &&
                ((fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ||
                 (fyp->state == FYPS_FLOW_SEQUENCE_ENTRY)))) {
          memset(&_drc_4.override_line,0,0x28);
          _drc_4.override_line = 4;
          _drc_4.override_column = 3;
          _drc_3._0_8_ = fy_token_ref(pfStack_20);
          pcVar5 = "end";
          if (pfStack_20->type == FYTT_DOCUMENT_START) {
            pcVar5 = "start";
          }
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)&_drc_4.override_line,
                     "invalid document %s indicator in a flow sequence",pcVar5);
        }
        else {
          memset(local_168,0,0x28);
          local_168._0_4_ = FYET_ERROR;
          local_168._4_4_ = FYEM_PARSE;
          _drc_4._0_8_ = fy_token_ref(pfStack_20);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)local_168,"did not find expected node content");
        }
        goto LAB_0014fe05;
      }
      if (pfStack_20->type == FYTT_ANCHOR) {
        tag = fy_scan_remove(fyp,pfStack_20);
      }
      else {
        handle = (char *)fy_scan_remove(fyp,pfStack_20);
      }
      pfStack_20 = fy_scan_peek(fyp);
      if (pfStack_20 == (fy_token *)0x0) {
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0xf4c,"fy_parse_node","failed to peek token");
        goto LAB_0014fe05;
      }
      pcVar5 = fy_token_type_txt[pfStack_20->type];
      fy_parser_diag(fyp,0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xf4f,"fy_parse_node","parse_node: ANCHOR|TAG got -  fyt %s",pcVar5);
    } while (pfStack_20->type != FYTT_ALIAS);
    memset(&_drc_1.override_line,0,0x28);
    _drc_1.override_line = 4;
    _drc_1.override_column = 3;
    fy_token_ref(pfStack_20);
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&_drc_1.override_line,"unexpected alias");
  }
LAB_0014fe05:
  fy_token_unref(tag);
  fy_token_unref((fy_token *)handle);
  fy_parse_eventp_recycle(fyp,(fy_eventp *)fye);
  return (fy_eventp *)0x0;
}

Assistant:

static struct fy_eventp *
fy_parse_node(struct fy_parser *fyp, struct fy_token *fyt, bool is_block) {
    struct fy_eventp *fyep = NULL;
    struct fy_event *fye = NULL;
    struct fy_document_state *fyds = NULL;
    struct fy_token *anchor = NULL, *tag = NULL;
    const char *handle;
    size_t handle_size;
    struct fy_atom atom;
    struct fy_token *fyt_td;

    fyds = fyp->current_document_state;
    assert(fyds);

    fyp_parse_debug(fyp, "parse_node: is_block=%s - fyt %s",
                    is_block ? "true" : "false",
                    fy_token_type_txt[fyt->type]);

    if (fyt->type == FYTT_ALIAS) {
        fy_parse_state_set(fyp, fy_parse_state_pop(fyp));

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_ALIAS;
        fye->alias.anchor = fy_scan_remove(fyp, fyt);

        goto return_ok;
    }

    while ((!anchor && fyt->type == FYTT_ANCHOR) || (!tag && fyt->type == FYTT_TAG)) {
        if (fyt->type == FYTT_ANCHOR)
            anchor = fy_scan_remove(fyp, fyt);
        else
            tag = fy_scan_remove(fyp, fyt);

        fyt = fy_scan_peek(fyp);
        fyp_error_check(fyp, fyt, err_out,
                        "failed to peek token");

        fyp_parse_debug(fyp, "parse_node: ANCHOR|TAG got -  fyt %s",
                        fy_token_type_txt[fyt->type]);

        FYP_TOKEN_ERROR_CHECK(fyp, fyt, FYEM_PARSE,
                              fyt->type != FYTT_ALIAS, err_out,
                              "unexpected alias");
    }

    /* check tag prefix */
    if (tag && tag->tag.handle_length) {
        handle = fy_atom_data(&tag->handle) + tag->tag.skip;
        handle_size = tag->tag.handle_length;

        fyt_td = fy_document_state_lookup_tag_directive(fyds, handle, handle_size);

        FYP_TOKEN_ERROR_CHECK(fyp, tag, FYEM_PARSE,
                              fyt_td, err_out,
                              "undefined tag prefix '%.*s'", (int) handle_size, handle);
    }

    if ((fyp->state == FYPS_BLOCK_NODE_OR_INDENTLESS_SEQUENCE ||
         fyp->state == FYPS_BLOCK_MAPPING_VALUE ||
         fyp->state == FYPS_BLOCK_MAPPING_FIRST_KEY)
        && fyt->type == FYTT_BLOCK_ENTRY) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SEQUENCE_START;
        fye->sequence_start.anchor = anchor;
        fye->sequence_start.tag = tag;

        atom = fyt->handle;
        atom.end_mark = atom.start_mark;    /* no extent */
        fye->sequence_start.sequence_start = fy_token_create(FYTT_BLOCK_SEQUENCE_START, &atom);
        fyp_error_check(fyp, fye->sequence_start.sequence_start, err_out,
                        "fy_token_create() failed!");

        fy_parse_state_set(fyp, FYPS_INDENTLESS_SEQUENCE_ENTRY);
        goto return_ok;
    }

    if (fyt->type == FYTT_SCALAR) {
        fy_parse_state_set(fyp, fy_parse_state_pop(fyp));

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SCALAR;
        fye->scalar.anchor = anchor;
        fye->scalar.tag = tag;
        fye->scalar.value = fy_scan_remove(fyp, fyt);
        goto return_ok;
    }

    if (fyt->type == FYTT_FLOW_SEQUENCE_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SEQUENCE_START;
        fye->sequence_start.anchor = anchor;
        fye->sequence_start.tag = tag;
        fye->sequence_start.sequence_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_FLOW_SEQUENCE_FIRST_ENTRY);
        goto return_ok;
    }

    if (fyt->type == FYTT_FLOW_MAPPING_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_MAPPING_START;
        fye->mapping_start.anchor = anchor;
        fye->mapping_start.tag = tag;
        fye->mapping_start.mapping_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_FLOW_MAPPING_FIRST_KEY);
        goto return_ok;
    }

    if (is_block && fyt->type == FYTT_BLOCK_SEQUENCE_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_SEQUENCE_START;
        fye->sequence_start.anchor = anchor;
        fye->sequence_start.tag = tag;
        fye->sequence_start.sequence_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_BLOCK_SEQUENCE_FIRST_ENTRY);
        goto return_ok;
    }

    if (is_block && fyt->type == FYTT_BLOCK_MAPPING_START) {

        fyep = fy_parse_eventp_alloc(fyp);
        fyp_error_check(fyp, fyep, err_out,
                        "fy_eventp_alloc() failed!");
        fye = &fyep->e;

        fye->type = FYET_MAPPING_START;
        fye->mapping_start.anchor = anchor;
        fye->mapping_start.tag = tag;
        fye->mapping_start.mapping_start = fy_scan_remove(fyp, fyt);
        fy_parse_state_set(fyp, FYPS_BLOCK_MAPPING_FIRST_KEY);
        goto return_ok;
    }

    if (!anchor && !tag) {

        if (fyt->type == FYTT_FLOW_ENTRY &&
            (fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ||
             fyp->state == FYPS_FLOW_SEQUENCE_ENTRY))

            FYP_TOKEN_ERROR(fyp, fyt, FYEM_PARSE,
                            "flow sequence with invalid %s",
                            fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ?
                            "comma in the beginning" : "extra comma");

        else if ((fyt->type == FYTT_DOCUMENT_START || fyt->type == FYTT_DOCUMENT_END) &&
                 (fyp->state == FYPS_FLOW_SEQUENCE_FIRST_ENTRY ||
                  fyp->state == FYPS_FLOW_SEQUENCE_ENTRY))

            FYP_TOKEN_ERROR(fyp, fyt, FYEM_PARSE,
                            "invalid document %s indicator in a flow sequence",
                            fyt->type == FYTT_DOCUMENT_START ?
                            "start" : "end");
        else
            FYP_TOKEN_ERROR(fyp, fyt, FYEM_PARSE,
                            "did not find expected node content");

        goto err_out;
    }

    fyp_parse_debug(fyp, "parse_node: empty scalar...");

    /* empty scalar */
    fy_parse_state_set(fyp, fy_parse_state_pop(fyp));

    fyep = fy_parse_eventp_alloc(fyp);
    fyp_error_check(fyp, fyep, err_out,
                    "fy_eventp_alloc() failed!");
    fye = &fyep->e;

    fye->type = FYET_SCALAR;
    fye->scalar.anchor = anchor;
    fye->scalar.tag = tag;
    fye->scalar.value = NULL;

    return_ok:
    fyp_parse_debug(fyp, "parse_node: > %s",
                    fy_event_type_txt[fye->type]);

    return fyep;

    err_out:
    fy_token_unref(anchor);
    fy_token_unref(tag);
    fy_parse_eventp_recycle(fyp, fyep);

    return NULL;
}